

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void UpdateHistogramCost(VP8LHistogram *h)

{
  int length;
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint32_t alpha_sym;
  uint64_t local_40;
  uint32_t blue_sym;
  uint32_t red_sym;
  
  local_40 = PopulationCost(h->alpha_,0x100,&alpha_sym,h->is_used_ + 3);
  uVar3 = PopulationCost(h->distance_,0x28,(uint32_t *)0x0,h->is_used_ + 4);
  uVar1 = (*VP8LExtraCost)(h->distance_,0x28);
  length = (1 << ((byte)h->palette_code_bits_ & 0x1f)) + 0x118;
  if (h->palette_code_bits_ < 1) {
    length = 0x118;
  }
  uVar4 = PopulationCost(h->literal_,length,(uint32_t *)0x0,h->is_used_);
  uVar2 = (*VP8LExtraCost)(h->literal_ + 0x100,0x18);
  h->literal_cost_ = (ulong)uVar2 * 0x800000 + uVar4;
  uVar4 = PopulationCost(h->red_,0x100,&red_sym,h->is_used_ + 1);
  h->red_cost_ = uVar4;
  uVar4 = PopulationCost(h->blue_,0x100,&blue_sym,h->is_used_ + 2);
  h->blue_cost_ = uVar4;
  h->bit_cost_ = uVar3 + local_40 + uVar4 + (ulong)uVar1 * 0x800000 + h->literal_cost_ +
                 h->red_cost_;
  uVar5 = red_sym << 0x10 | alpha_sym << 0x18 | blue_sym;
  if ((red_sym | alpha_sym | blue_sym) == 0xffffffff) {
    uVar5 = 0xffffffff;
  }
  h->trivial_symbol_ = uVar5;
  return;
}

Assistant:

static void UpdateHistogramCost(VP8LHistogram* const h) {
  uint32_t alpha_sym, red_sym, blue_sym;
  const uint64_t alpha_cost =
      PopulationCost(h->alpha_, NUM_LITERAL_CODES, &alpha_sym, &h->is_used_[3]);
  const uint64_t distance_cost =
      PopulationCost(h->distance_, NUM_DISTANCE_CODES, NULL, &h->is_used_[4]) +
      ((uint64_t)VP8LExtraCost(h->distance_, NUM_DISTANCE_CODES)
       << LOG_2_PRECISION_BITS);
  const int num_codes = VP8LHistogramNumCodes(h->palette_code_bits_);
  h->literal_cost_ =
      PopulationCost(h->literal_, num_codes, NULL, &h->is_used_[0]) +
      ((uint64_t)VP8LExtraCost(h->literal_ + NUM_LITERAL_CODES,
                               NUM_LENGTH_CODES)
       << LOG_2_PRECISION_BITS);
  h->red_cost_ =
      PopulationCost(h->red_, NUM_LITERAL_CODES, &red_sym, &h->is_used_[1]);
  h->blue_cost_ =
      PopulationCost(h->blue_, NUM_LITERAL_CODES, &blue_sym, &h->is_used_[2]);
  h->bit_cost_ = h->literal_cost_ + h->red_cost_ + h->blue_cost_ +
                 alpha_cost + distance_cost;
  if ((alpha_sym | red_sym | blue_sym) == VP8L_NON_TRIVIAL_SYM) {
    h->trivial_symbol_ = VP8L_NON_TRIVIAL_SYM;
  } else {
    h->trivial_symbol_ =
        ((uint32_t)alpha_sym << 24) | (red_sym << 16) | (blue_sym << 0);
  }
}